

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O2

int bitmap_iterator_next(bitmap_iterator_t *iter,size_t *nbit)

{
  size_t sVar1;
  bitmap_el_t *pbVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = iter->nbit >> 6;
  sVar1 = VARR_bitmap_el_tlength(iter->bitmap);
  pbVar2 = VARR_bitmap_el_taddr(iter->bitmap);
  do {
    if (sVar1 <= uVar5) {
      return 0;
    }
    if (pbVar2[uVar5] != 0) {
      uVar3 = iter->nbit;
      for (uVar4 = pbVar2[uVar5] >> (uVar3 & 0x3f); uVar4 != 0; uVar4 = uVar4 >> 1) {
        if ((uVar4 & 1) != 0) {
          iter->nbit = uVar3 + 1;
          *nbit = uVar3;
          return 1;
        }
        uVar3 = uVar3 + 1;
        iter->nbit = uVar3;
      }
    }
    uVar5 = uVar5 + 1;
    iter->nbit = uVar5 * 0x40;
  } while( true );
}

Assistant:

static inline int bitmap_iterator_next (bitmap_iterator_t *iter, size_t *nbit) {
  const size_t el_bits_num = sizeof (bitmap_el_t) * CHAR_BIT;
  size_t curr_nel = iter->nbit / el_bits_num, len = VARR_LENGTH (bitmap_el_t, iter->bitmap);
  bitmap_el_t el, *addr = VARR_ADDR (bitmap_el_t, iter->bitmap);

  for (; curr_nel < len; curr_nel++, iter->nbit = curr_nel * el_bits_num)
    if ((el = addr[curr_nel]) != 0)
      for (el >>= iter->nbit % el_bits_num; el != 0; el >>= 1, iter->nbit++)
        if (el & 1) {
          *nbit = iter->nbit++;
          return TRUE;
        }
  return FALSE;
}